

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

tuple<pstore::json::details::string_matcher<pstore::json::null_output>::state,_pstore::json::error_code>
 __thiscall
pstore::json::details::string_matcher<pstore::json::null_output>::consume_escape_state
          (string_matcher<pstore::json::null_output> *this,char32_t code_point,appender *app)

{
  undefined4 uVar1;
  state *psVar2;
  maybe<pstore::json::details::string_matcher<pstore::json::null_output>::state,_void> x;
  maybe<std::tuple<char32_t,_pstore::json::details::string_matcher<pstore::json::null_output>::state>,_void>
  local_20;
  maybe<pstore::json::details::string_matcher<pstore::json::null_output>::state,_void> local_10;
  
  uVar1 = 3;
  if (code_point < L'b') {
    if (((code_point != L'\"') && (code_point != L'/')) && (code_point != L'\\')) {
switchD_001502a1_caseD_6f:
      local_20.storage_._4_4_ = L'\0';
      local_20._0_8_ = 0;
      goto LAB_001502f5;
    }
  }
  else {
    switch(code_point) {
    case L'n':
      code_point = L'\n';
      break;
    case L'o':
    case L'p':
    case L'q':
    case L's':
      goto switchD_001502a1_caseD_6f;
    case L'r':
      code_point = L'\r';
      break;
    case L't':
      code_point = L'\t';
      break;
    case L'u':
      uVar1 = 5;
      break;
    default:
      if (code_point == L'f') {
        code_point = L'\f';
      }
      else {
        if (code_point != L'b') goto switchD_001502a1_caseD_6f;
        code_point = L'\b';
      }
    }
  }
  local_20.valid_ = true;
  local_20.storage_.__align = (anon_struct_4_0_00000001_for___align)uVar1;
  local_20.storage_._4_4_ = code_point;
LAB_001502f5:
  operator>>=(&local_10,&local_20,(anon_class_8_1_ba1d3581)app);
  if (local_20.valid_ == true) {
    local_20._0_8_ = local_20._0_8_ & 0xffffffffffffff00;
  }
  if (local_10.valid_ == true) {
    psVar2 = maybe<pstore::json::details::string_matcher<pstore::json::null_output>::state,_void>::
             operator->(&local_10);
    *(undefined4 *)&(this->super_matcher<pstore::json::null_output>)._vptr_matcher = 0;
    *(state *)((long)&(this->super_matcher<pstore::json::null_output>)._vptr_matcher + 4) = *psVar2;
  }
  else {
    (this->super_matcher<pstore::json::null_output>)._vptr_matcher = (_func_int **)0x300000009;
  }
  return (tuple<pstore::json::details::string_matcher<pstore::json::null_output>::state,_pstore::json::error_code>
          )(_Tuple_impl<0UL,_pstore::json::details::string_matcher<pstore::json::null_output>::state,_pstore::json::error_code>
            )this;
}

Assistant:

auto string_matcher<Callbacks>::consume_escape_state (char32_t code_point,
                                                                  appender & app)
                -> std::tuple<state, error_code> {

                auto decode = [] (char32_t cp) {
                    state next_state = normal_char_state;
                    switch (cp) {
                    case '"': cp = '"'; break;
                    case '\\': cp = '\\'; break;
                    case '/': cp = '/'; break;
                    case 'b': cp = '\b'; break;
                    case 'f': cp = '\f'; break;
                    case 'n': cp = '\n'; break;
                    case 'r': cp = '\r'; break;
                    case 't': cp = '\t'; break;
                    case 'u': next_state = hex1_state; break;
                    default: return nothing<std::tuple<char32_t, state>> ();
                    }
                    return just (std::make_tuple (cp, next_state));
                };

                auto append = [&app] (std::tuple<char32_t, state> const & s) {
                    char32_t const cp = std::get<0> (s);
                    state const next_state = std::get<1> (s);
                    PSTORE_ASSERT (next_state == normal_char_state || next_state == hex1_state);
                    if (next_state == normal_char_state) {
                        if (!app.append32 (cp)) {
                            return nothing<state> ();
                        }
                    }
                    return just (next_state);
                };

                maybe<state> const x = decode (code_point) >>= append;
                return x ? std::make_tuple (*x, error_code::none)
                         : std::make_tuple (normal_char_state, error_code::invalid_escape_char);
            }